

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uarrsort.cpp
# Opt level: O0

void uprv_sortArray_63(void *array,int32_t length,int32_t itemSize,UComparator *cmp,void *context,
                      UBool sortStable,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UBool sortStable_local;
  void *context_local;
  UComparator *cmp_local;
  int32_t itemSize_local;
  int32_t length_local;
  void *array_local;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (UVar1 = U_FAILURE(*pErrorCode), UVar1 == '\0')) {
    if (((length < 1) || (array != (void *)0x0)) &&
       (((-1 < length && (0 < itemSize)) && (cmp != (UComparator *)0x0)))) {
      if (1 < length) {
        if ((length < 9) || (sortStable != '\0')) {
          insertionSort((char *)array,length,itemSize,cmp,context,pErrorCode);
        }
        else {
          quickSort((char *)array,length,itemSize,cmp,context,pErrorCode);
        }
      }
    }
    else {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_sortArray(void *array, int32_t length, int32_t itemSize,
               UComparator *cmp, const void *context,
               UBool sortStable, UErrorCode *pErrorCode) {
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }
    if((length>0 && array==NULL) || length<0 || itemSize<=0 || cmp==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(length<=1) {
        return;
    } else if(length<MIN_QSORT || sortStable) {
        insertionSort((char *)array, length, itemSize, cmp, context, pErrorCode);
    } else {
        quickSort((char *)array, length, itemSize, cmp, context, pErrorCode);
    }
}